

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_relational_expression(xpath_parser *this)

{
  lexeme_t lVar1;
  xpath_ast_node *pxVar2;
  xpath_ast_node *pxVar3;
  xpath_ast_node *pxVar4;
  byte bVar5;
  lexeme_t l;
  
  pxVar2 = parse_additive_expression(this);
  while (lVar1 = (this->_lexer)._cur_lexeme, lVar1 - lex_less < 4) {
    xpath_lexer::next(&this->_lexer);
    pxVar3 = parse_additive_expression(this);
    pxVar4 = (xpath_ast_node *)alloc_node(this);
    if (lVar1 == lex_less) {
      bVar5 = 4;
    }
    else if (lVar1 == lex_greater) {
      bVar5 = 5;
    }
    else {
      bVar5 = lVar1 == lex_less_or_equal ^ 7;
    }
    pxVar4->_type = bVar5;
    pxVar4->_rettype = '\x04';
    pxVar4->_axis = '\0';
    pxVar4->_test = '\0';
    pxVar4->_left = pxVar2;
    pxVar4->_right = pxVar3;
    pxVar4->_next = (xpath_ast_node *)0x0;
    pxVar2 = pxVar4;
  }
  return pxVar2;
}

Assistant:

xpath_ast_node* parse_relational_expression()
		{
			xpath_ast_node* n = parse_additive_expression();

			while (_lexer.current() == lex_less || _lexer.current() == lex_less_or_equal || 
				   _lexer.current() == lex_greater || _lexer.current() == lex_greater_or_equal)
			{
				lexeme_t l = _lexer.current();
				_lexer.next();

				xpath_ast_node* expr = parse_additive_expression();

				n = new (alloc_node()) xpath_ast_node(l == lex_less ? ast_op_less : l == lex_greater ? ast_op_greater :
								l == lex_less_or_equal ? ast_op_less_or_equal : ast_op_greater_or_equal, xpath_type_boolean, n, expr);
			}

			return n;
		}